

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  uint uVar1;
  undefined8 uVar2;
  char *str;
  String *in_stack_ffffffffffffff20;
  StreamingListener *this_00;
  undefined1 local_c0 [80];
  undefined1 local_70 [48];
  String local_40 [2];
  char *local_20;
  char *file_name;
  TestPartResult *test_part_result_local;
  StreamingListener *this_local;
  
  file_name = (char *)test_part_result;
  test_part_result_local = (TestPartResult *)this;
  local_20 = TestPartResult::file_name(test_part_result);
  if (local_20 == (char *)0x0) {
    local_20 = "";
  }
  UrlEncode_abi_cxx11_((StreamingListener *)local_70,local_20);
  uVar2 = std::__cxx11::string::c_str();
  uVar1 = TestPartResult::line_number((TestPartResult *)file_name);
  String::Format((String *)(local_70 + 0x20),"event=TestPartResult&file=%s&line=%d&message=",uVar2,
                 (ulong)uVar1);
  String::operator_cast_to_string(local_40);
  Send(this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  String::~String(in_stack_ffffffffffffff20);
  std::__cxx11::string::~string((string *)local_70);
  str = TestPartResult::message((TestPartResult *)file_name);
  this_00 = (StreamingListener *)local_c0;
  UrlEncode_abi_cxx11_(this_00,str);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c0 + 0x20),(char *)this_00);
  Send(this,(string *)(local_c0 + 0x20));
  std::__cxx11::string::~string((string *)(local_c0 + 0x20));
  std::__cxx11::string::~string((string *)local_c0);
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) {
    const char* file_name = test_part_result.file_name();
    if (file_name == NULL)
      file_name = "";
    Send(String::Format("event=TestPartResult&file=%s&line=%d&message=",
                        UrlEncode(file_name).c_str(),
                        test_part_result.line_number()));
    Send(UrlEncode(test_part_result.message()) + "\n");
  }